

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void forbody(LexState *ls,int base,int line,int nvars,int isnum)

{
  LexState *ls_00;
  long lVar1;
  int list;
  int list_00;
  BlockCnt bl;
  undefined8 local_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  
  ls_00 = (LexState *)ls->fs;
  adjustlocalvars(ls_00,3);
  checknext(ls,0x103);
  if (isnum == 0) {
    list = luaK_jump((FuncState *)ls_00);
  }
  else {
    list = luaK_codeABx((FuncState *)ls_00,OP_FORPREP,base,0x1fffe);
  }
  local_32 = 0;
  local_34 = *(undefined1 *)((long)&ls_00->z + 2);
  lVar1 = *(long *)((long)(ls_00->t).seminfo.ts + 0x50);
  local_38 = *(undefined2 *)(lVar1 + 0x28);
  local_36 = *(undefined2 *)(lVar1 + 0x18);
  local_33 = 0;
  local_40 = *(undefined8 *)&ls_00->lookahead;
  *(undefined8 **)&ls_00->lookahead = &local_40;
  adjustlocalvars((LexState *)ls->fs,nvars);
  luaK_reserveregs((FuncState *)ls_00,nvars);
  block(ls);
  leaveblock((FuncState *)ls_00);
  luaK_patchtohere((FuncState *)ls_00,list);
  if (isnum == 0) {
    luaK_codeABC((FuncState *)ls_00,OP_TFORCALL,base,0,nvars);
    luaK_fixline((FuncState *)ls_00,line);
    list_00 = luaK_codeABx((FuncState *)ls_00,OP_TFORLOOP,base + 2,0x1fffe);
  }
  else {
    list_00 = luaK_codeABx((FuncState *)ls_00,OP_FORLOOP,base,0x1fffe);
  }
  luaK_patchlist((FuncState *)ls_00,list_00,list + 1);
  luaK_fixline((FuncState *)ls_00,line);
  return;
}

Assistant:

static void forbody (LexState *ls, int base, int line, int nvars, int isnum) {
  /* forbody -> DO block */
  BlockCnt bl;
  FuncState *fs = ls->fs;
  int prep, endfor;
  adjustlocalvars(ls, 3);  /* control variables */
  checknext(ls, TK_DO);
  prep = isnum ? luaK_codeAsBx(fs, OP_FORPREP, base, NO_JUMP) : luaK_jump(fs);
  enterblock(fs, &bl, 0);  /* scope for declared variables */
  adjustlocalvars(ls, nvars);
  luaK_reserveregs(fs, nvars);
  block(ls);
  leaveblock(fs);  /* end of scope for declared variables */
  luaK_patchtohere(fs, prep);
  if (isnum)  /* numeric for? */
    endfor = luaK_codeAsBx(fs, OP_FORLOOP, base, NO_JUMP);
  else {  /* generic for */
    luaK_codeABC(fs, OP_TFORCALL, base, 0, nvars);
    luaK_fixline(fs, line);
    endfor = luaK_codeAsBx(fs, OP_TFORLOOP, base + 2, NO_JUMP);
  }
  luaK_patchlist(fs, endfor, prep + 1);
  luaK_fixline(fs, line);
}